

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O3

double __thiscall libcalc::Tokenizer::evaluate(Tokenizer *this)

{
  Token *pTVar1;
  int iVar2;
  _Map_pointer ppdVar3;
  uint uVar4;
  pointer ppTVar5;
  char cVar6;
  double *pdVar7;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> local_c0;
  double *local_a8;
  double *local_a0;
  undefined1 auStack_98 [8];
  stack<double,_std::deque<double,_std::allocator<double>_>_> temp;
  double *local_40;
  double a;
  
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_first = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_last = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_cur = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map
            ((_Deque_base<double,_std::allocator<double>_> *)auStack_98,0);
  toRPN(&local_c0,this);
  if (local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppTVar5 = local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pTVar1 = *ppTVar5;
      if (pTVar1->type == '\x01') {
        if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node ==
            (_Map_pointer)
            temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_cur) {
          a = *(double *)
               ((long)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_last[-1] + 0x1f8);
          operator_delete(temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur);
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur =
               (_Elt_pointer)
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last[-1];
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_first =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur + 0x40;
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               (_Map_pointer)
               (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur + 0x3f);
          cVar6 = *(pTVar1->value)._M_dataplus._M_p;
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_last =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last + -1;
LAB_001032b9:
          pdVar7 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                   super__Deque_impl_data._M_start._M_node[-1];
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_node + -1;
        }
        else {
          a = (double)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node[-1];
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_node + -1;
          cVar6 = *(pTVar1->value)._M_dataplus._M_p;
          if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
              super__Deque_impl_data._M_start._M_node !=
              (_Map_pointer)
              temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur) goto LAB_001032b9;
          local_a0 = *(double **)
                      ((long)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_last[-1] + 0x1f8);
          operator_delete(temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur);
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur =
               (_Elt_pointer)
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last[-1];
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_first =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur + 0x40;
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               (_Map_pointer)
               (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur + 0x3f);
          pdVar7 = local_a0;
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_last =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last + -1;
        }
        switch(cVar6) {
        case '!':
          iVar2 = factorial((int)a);
          local_40 = (double *)(double)iVar2;
          break;
        case '\"':
        case '#':
        case '$':
        case '&':
        case '\'':
        case '(':
        case ')':
        case ',':
        case '.':
          break;
        case '%':
          uVar4 = (int)(double)pdVar7 % (int)a;
LAB_00103343:
          local_40 = (double *)(double)(int)uVar4;
          break;
        case '*':
          local_40 = (double *)(a * (double)pdVar7);
          break;
        case '+':
          local_40 = (double *)(a + (double)pdVar7);
          break;
        case '-':
          local_40 = (double *)((double)pdVar7 - a);
          break;
        case '/':
          local_40 = (double *)((double)pdVar7 / a);
          break;
        default:
          if (cVar6 == '^') {
            uVar4 = (int)a ^ (int)(double)pdVar7;
            goto LAB_00103343;
          }
        }
        if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node ==
            (_Map_pointer)
            (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first + -1)) {
          std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                    ((deque<double,std::allocator<double>> *)auStack_98,(double *)&local_40);
        }
        else {
          *temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
           _M_start._M_node = local_40;
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_node + 1;
        }
      }
      else {
        local_a8 = (double *)atof((pTVar1->value)._M_dataplus._M_p);
        if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node ==
            (_Map_pointer)
            (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first + -1)) {
          std::deque<double,_std::allocator<double>_>::_M_push_back_aux<double>
                    ((deque<double,_std::allocator<double>_> *)auStack_98,(double *)&local_a8);
        }
        else {
          *temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
           _M_start._M_node = local_a8;
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_node + 1;
        }
      }
      ppTVar5 = ppTVar5 + 1;
    } while (ppTVar5 !=
             local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ppdVar3 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node;
  if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node ==
      (_Map_pointer)
      temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur) {
    ppdVar3 = (_Map_pointer)
              ((long)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_last[-1] + 0x200);
  }
  a = (double)ppdVar3[-1];
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
            ((_Deque_base<double,_std::allocator<double>_> *)auStack_98);
  return a;
}

Assistant:

double Tokenizer::evaluate() {
  std::stack<double> temp;
  double l, a, r;
  char o;

  for (Token *t : toRPN()) {
    if (t->type == TOKEN_TYPE.OPERATOR) {

      r = temp.top();
      temp.pop();

      o = t->value.c_str()[0];

      l = temp.top();
      temp.pop();

      switch(o) {
        case '+': a =  l + r ; break;
        case '-': a =  l - r ; break;
        case '*': a =  l * r ; break;
        case '/': a =  l / r ; break;
        case '%': a =  (int)l % (int) r ; break;
        case '^': a =  (int)l ^ (int)r ; break;
        case '!': a =  factorial(r) ; break;
      }

      temp.push(a);

    } else {
      temp.push(std::atof(t->value.c_str()));
    }
  }

  return temp.top();
}